

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall cmStateDirectory::SetCurrentBinary(cmStateDirectory *this,string *dir)

{
  string *path;
  PointerType pBVar1;
  allocator<char> local_39;
  string local_38;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  path = &pBVar1->OutputLocation;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_38,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ComputeRelativePathTopBinary(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_CURRENT_BINARY_DIR",&local_39);
  cmStateSnapshot::SetDefinition(&this->Snapshot_,&local_38,path);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmStateDirectory::SetCurrentBinary(std::string const& dir)
{
  std::string& loc = this->DirectoryState->OutputLocation;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  this->ComputeRelativePathTopBinary();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_BINARY_DIR", loc);
}